

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::objectivec::FileClassName_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FileDescriptor *file)

{
  string_view extension;
  char *in_RCX;
  FileDescriptor *file_00;
  undefined1 in_R8B;
  string_view filename;
  string_view input;
  basic_string_view<char,_std::char_traits<char>_> local_178;
  string_view local_168;
  string_view local_158;
  AlphaNum local_148;
  string local_108;
  undefined1 local_e8 [16];
  string local_d8;
  undefined1 local_b8 [16];
  string local_a8;
  AlphaNum local_88;
  undefined1 local_58 [8];
  string name;
  string prefix;
  FileDescriptor *file_local;
  
  FileClassPrefix_abi_cxx11_((string *)((long)&name.field_2 + 8),this,file);
  BaseFileName_abi_cxx11_(&local_108,this,file_00);
  local_e8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_108);
  filename._M_len = local_e8._8_8_;
  filename._M_str = in_RCX;
  StripProto_abi_cxx11_(&local_d8,local_e8._0_8_,filename);
  local_b8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_d8);
  input._M_len = local_b8._8_8_;
  input._M_str = (char *)0x1;
  (anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
            (&local_a8,local_b8._0_8_,input,(bool)in_R8B);
  absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_88,&local_a8);
  absl::lts_20240722::AlphaNum::AlphaNum(&local_148,"Root");
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_58,&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_108);
  local_158 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)(name.field_2._M_local_buf + 8));
  local_168 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_58);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_178,"_RootClass");
  extension._M_str = local_178._M_str;
  extension._M_len = local_178._M_len;
  anon_unknown_0::SanitizeNameForObjC
            (__return_storage_ptr__,local_158,local_168,extension,(string *)0x0);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string FileClassName(const FileDescriptor* file) {
  const std::string prefix = FileClassPrefix(file);
  const std::string name = absl::StrCat(
      UnderscoresToCamelCase(StripProto(BaseFileName(file)), true), "Root");
  // There aren't really any reserved words that end in "Root", but playing
  // it safe and checking.
  return SanitizeNameForObjC(prefix, name, "_RootClass", nullptr);
}